

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int __thiscall icu_63::UnicodeSet::remove(UnicodeSet *this,char *__filename)

{
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  int32_t cp;
  UnicodeString *s_local;
  UnicodeSet *this_local;
  
  iVar2 = UnicodeString::length((UnicodeString *)__filename);
  if (((iVar2 != 0) && (UVar1 = isFrozen(this), UVar1 == '\0')) &&
     (UVar1 = isBogus(this), UVar1 == '\0')) {
    uVar3 = getSingleCP((UnicodeString *)__filename);
    if ((int)uVar3 < 0) {
      UVector::removeElement(this->strings,__filename);
      releasePattern(this);
    }
    else {
      remove(this,(char *)(ulong)uVar3);
    }
  }
  return (int)this;
}

Assistant:

UnicodeSet& UnicodeSet::remove(const UnicodeString& s) {
    if (s.length() == 0 || isFrozen() || isBogus()) return *this;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        strings->removeElement((void*) &s);
        releasePattern();
    } else {
        remove((UChar32)cp, (UChar32)cp);
    }
    return *this;
}